

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

size_t FourCCToString(tchar_t *Out,size_t OutLen,fourcc_t FourCC)

{
  ulong uVar1;
  size_t __n;
  anon_union_4_2_94730004 s;
  undefined1 local_14 [4];
  
  if (OutLen == 0) {
    __n = 0;
  }
  else {
    uVar1 = OutLen - 1;
    if (uVar1 != 0) {
      __n = 4;
      if (uVar1 < 4) {
        __n = uVar1;
      }
      memcpy(Out,local_14,__n);
      do {
        if (Out[__n - 1] != '_') goto LAB_0012e01c;
        __n = __n - 1;
      } while (__n != 0);
    }
    __n = 0;
LAB_0012e01c:
    Out[__n] = '\0';
  }
  return __n;
}

Assistant:

size_t FourCCToString(tchar_t* Out, size_t OutLen, fourcc_t FourCC)
{
    size_t i=0;
    if (OutLen)
    {
	    union
	    {
		    fourcc_t d;
		    uint8_t a[4];
	    } s;

	    s.d = FourCC;
	    for (i=0;i<4 && i<OutLen-1;++i)
            Out[i] = s.a[i];

        while (i>0 && Out[i-1]=='_')
            --i;

        Out[i] = 0;
    }
    return i;
}